

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)

{
  SQObjectType SVar1;
  SQTable *x;
  SQObjectPtr *pSVar2;
  SQRESULT SVar3;
  SQObjectPtr local_20;
  
  pSVar2 = stack_get(v,idx);
  SVar1 = (pSVar2->super_SQObject)._type;
  if ((SVar1 == OT_USERDATA) || (SVar1 == OT_TABLE)) {
    x = ((pSVar2->super_SQObject)._unVal.pDelegable)->_delegate;
    if (x == (SQTable *)0x0) {
      SQVM::PushNull(v);
    }
    else {
      SQObjectPtr::SQObjectPtr(&local_20,x);
      SQVM::Push(v,&local_20);
      SQObjectPtr::~SQObjectPtr(&local_20);
    }
    SVar3 = 0;
  }
  else {
    sq_throwerror(v,"wrong type");
    SVar3 = -1;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_getdelegate(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    switch(sq_type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        if(!_delegable(self)->_delegate){
            v->PushNull();
            break;
        }
        v->Push(SQObjectPtr(_delegable(self)->_delegate));
        break;
    default: return sq_throwerror(v,_SC("wrong type")); break;
    }
    return SQ_OK;

}